

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_interface.c
# Opt level: O1

int dlep_if_add(dlep_if *interf,char *ifname,oonf_layer2_origin *l2_origin,
               oonf_layer2_origin *l2_default_origin,_func_int_os_interface_listener_ptr *if_changed
               ,oonf_log_source log_src,_Bool radio)

{
  char *dest;
  autobuf *autobuf;
  int iVar1;
  list_entity *plVar2;
  avl_tree *paVar3;
  list_entity *plVar4;
  
  dest = interf->l2_ifname;
  strscpy(dest,ifname,0x10);
  (interf->_node).key = dest;
  autobuf = &interf->udp_out;
  iVar1 = abuf_init(autobuf);
  if (iVar1 == 0) {
    abuf_memcpy(autobuf,"DLEP",4);
    iVar1 = dlep_session_add(&interf->session,dest,l2_origin,l2_default_origin,autobuf,radio,
                             if_changed,log_src);
    if (iVar1 == 0) {
      interf->radio = radio;
      avl_init(&interf->session_tree,avl_comp_netaddr_socket,false);
      (interf->udp).config.user = interf;
      (interf->udp).config.receive_data = _cb_receive_udp;
      oonf_packet_add_managed(&interf->udp);
      (interf->session).cb_send_buffer = _cb_send_multicast;
      (interf->session).cb_end_session = (_func_void_dlep_session_ptr *)0x0;
      (interf->session).restrict_signal = DLEP_UDP_PEER_OFFER - (uint)radio;
      (interf->session).writer.out = autobuf;
      paVar3 = &_router_if_tree;
      if (radio) {
        paVar3 = &_radio_if_tree;
      }
      avl_insert(paVar3,&interf->_node);
      paVar3 = dlep_extension_get_tree();
      for (plVar4 = (paVar3->list_head).next; plVar2 = plVar4->prev,
          paVar3 = dlep_extension_get_tree(), plVar2 != (paVar3->list_head).prev;
          plVar4 = plVar4->next) {
        if (radio) {
          plVar2 = plVar4[-4].next;
        }
        else {
          plVar2 = plVar4[-4].prev;
        }
        if (plVar2 != (list_entity *)0x0) {
          (*(code *)plVar2)(interf);
        }
      }
      return 0;
    }
    abuf_free(autobuf);
  }
  return -1;
}

Assistant:

int
dlep_if_add(struct dlep_if *interf, const char *ifname, const struct oonf_layer2_origin *l2_origin,
  const struct oonf_layer2_origin *l2_default_origin,
  int (*if_changed)(struct os_interface_listener *), enum oonf_log_source log_src, bool radio) {
  struct dlep_extension *ext;

  /* initialize key */
  strscpy(interf->l2_ifname, ifname, sizeof(interf->l2_ifname));
  interf->_node.key = interf->l2_ifname;

  if (abuf_init(&interf->udp_out)) {
    return -1;
  }

  /* add dlep prefix to buffer */
  abuf_memcpy(&interf->udp_out, _DLEP_PREFIX, sizeof(_DLEP_PREFIX) - 1);

  if (dlep_session_add(&interf->session, interf->l2_ifname,
    l2_origin, l2_default_origin, &interf->udp_out, radio, if_changed, log_src)) {
    abuf_free(&interf->udp_out);
    return -1;
  }

  /* remember if this is a radio interface */
  interf->radio = radio;

  /* initialize stream list */
  avl_init(&interf->session_tree, avl_comp_netaddr_socket, false);

  /* initialize discovery socket */
  interf->udp.config.user = interf;
  interf->udp.config.receive_data = _cb_receive_udp;
  oonf_packet_add_managed(&interf->udp);

  /* initialize session */
  interf->session.cb_send_buffer = _cb_send_multicast;
  interf->session.cb_end_session = NULL;
  interf->session.restrict_signal = radio ? DLEP_UDP_PEER_DISCOVERY : DLEP_UDP_PEER_OFFER;
  interf->session.writer.out = &interf->udp_out;

  /* add to tree */
  avl_insert(dlep_if_get_tree(radio), &interf->_node);

  /* inform all extension */
  avl_for_each_element(dlep_extension_get_tree(), ext, _node) {
    if (radio) {
      if (ext->cb_session_init_radio) {
        ext->cb_session_init_radio(&interf->session);
      }
    }
    else {
      if (ext->cb_session_init_router) {
        ext->cb_session_init_router(&interf->session);
      }
    }
  }
  return 0;
}